

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O1

GLFWwindow *
glfwCreateWindow(int width,int height,char *title,GLFWmonitor *monitor,GLFWwindow *share)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uintptr_t uVar4;
  GLFWbool GVar5;
  int iVar6;
  _GLFWwindow *window;
  _GLFWwindow *handle;
  long lVar7;
  _GLFWlibrary *p_Var8;
  undefined8 *puVar9;
  undefined1 local_e0 [8];
  _GLFWfbconfig fbconfig;
  _GLFWctxconfig ctxconfig;
  _GLFWwndconfig wndconfig;
  
  uVar3 = _glfw.hints.window._32_8_;
  uVar2 = _glfw.hints.window._24_8_;
  uVar1 = _glfw.hints.window._16_8_;
  if (title == (char *)0x0) {
    __assert_fail("title != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/glfw/src/window.c"
                  ,0x82,
                  "GLFWwindow *glfwCreateWindow(int, int, const char *, GLFWmonitor *, GLFWwindow *)"
                 );
  }
  if (_glfwInitialized == 0) {
    iVar6 = 0x10001;
  }
  else {
    if (width < 1 || height < 1) {
      _glfwInputError(0x10004,"Invalid window size %ix%i",(ulong)(uint)width,(ulong)(uint)height);
      return (GLFWwindow *)0x0;
    }
    p_Var8 = &_glfw;
    puVar9 = (undefined8 *)local_e0;
    for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
      *puVar9 = *(undefined8 *)&(p_Var8->hints).framebuffer;
      p_Var8 = (_GLFWlibrary *)&(p_Var8->hints).framebuffer.blueBits;
      puVar9 = puVar9 + 1;
    }
    ctxconfig._24_8_ = _glfw.hints.context._32_8_;
    ctxconfig._8_8_ = _glfw.hints.context._16_8_;
    ctxconfig._16_8_ = _glfw.hints.context._24_8_;
    fbconfig.handle = _glfw.hints.context._0_8_;
    uVar4 = fbconfig.handle;
    ctxconfig._0_8_ = _glfw.hints.context._8_8_;
    ctxconfig.share = (_GLFWwindow *)CONCAT44(height,width);
    fbconfig.handle = uVar4;
    ctxconfig._32_8_ = share;
    if ((share == (GLFWwindow *)0x0) ||
       ((fbconfig.handle._0_4_ = _glfw.hints.context.client, (int)fbconfig.handle != 0 &&
        (*(int *)(share + 0x1f0) != 0)))) {
      GVar5 = _glfwIsValidContextConfig((_GLFWctxconfig *)&fbconfig.handle);
      if (GVar5 != 0) {
        window = (_GLFWwindow *)calloc(1,0x358);
        window->next = _glfw.windowListHead;
        _glfw.windowListHead = window;
        (window->videoMode).width = width;
        (window->videoMode).height = height;
        (window->videoMode).redBits = local_e0._0_4_;
        (window->videoMode).greenBits = local_e0._4_4_;
        (window->videoMode).blueBits = fbconfig.redBits;
        (window->videoMode).refreshRate = _glfw.hints.refreshRate;
        window->monitor = (_GLFWmonitor *)monitor;
        wndconfig.title._0_4_ = (GLFWbool)uVar1;
        window->resizable = (GLFWbool)wndconfig.title;
        wndconfig.resizable = (GLFWbool)uVar2;
        window->decorated = wndconfig.resizable;
        wndconfig.decorated = (GLFWbool)uVar3;
        window->autoIconify = wndconfig.decorated;
        wndconfig.focused = SUB84(uVar3,4);
        window->floating = wndconfig.focused;
        window->cursorMode = 0x34001;
        window->minwidth = -1;
        window->minheight = -1;
        window->maxwidth = -1;
        window->maxheight = -1;
        window->numer = -1;
        window->denom = -1;
        handle = _glfwPlatformGetCurrentContext();
        if ((int)fbconfig.handle != 0) {
          glfwMakeContextCurrent((GLFWwindow *)0x0);
        }
        iVar6 = _glfwPlatformCreateWindow
                          (window,(_GLFWwndconfig *)&ctxconfig.share,
                           (_GLFWctxconfig *)&fbconfig.handle,(_GLFWfbconfig *)local_e0);
        if (iVar6 == 0) {
          glfwMakeContextCurrent((GLFWwindow *)handle);
        }
        else {
          if ((int)fbconfig.handle == 0) {
LAB_0012b025:
            if (window->monitor != (_GLFWmonitor *)0x0) {
              return (GLFWwindow *)window;
            }
            wndconfig.title._4_4_ = SUB84(uVar1,4);
            if (wndconfig.title._4_4_ == 0) {
              return (GLFWwindow *)window;
            }
            _glfwPlatformShowWindow(window);
            wndconfig.visible = SUB84(uVar2,4);
            if (wndconfig.visible == 0) {
              return (GLFWwindow *)window;
            }
            _glfwPlatformFocusWindow(window);
            return (GLFWwindow *)window;
          }
          (*(window->context).makeCurrent)(window);
          GVar5 = _glfwRefreshContextAttribs((_GLFWctxconfig *)&fbconfig.handle);
          glfwMakeContextCurrent((GLFWwindow *)handle);
          if (GVar5 != 0) goto LAB_0012b025;
        }
        glfwDestroyWindow((GLFWwindow *)window);
      }
      return (GLFWwindow *)0x0;
    }
    iVar6 = 0x1000a;
  }
  _glfwInputError(iVar6,(char *)0x0);
  return (GLFWwindow *)0x0;
}

Assistant:

GLFWAPI GLFWwindow* glfwCreateWindow(int width, int height,
                                     const char* title,
                                     GLFWmonitor* monitor,
                                     GLFWwindow* share)
{
    _GLFWfbconfig fbconfig;
    _GLFWctxconfig ctxconfig;
    _GLFWwndconfig wndconfig;
    _GLFWwindow* window;
    _GLFWwindow* previous;

    assert(title != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (width <= 0 || height <= 0)
    {
        _glfwInputError(GLFW_INVALID_VALUE,
                        "Invalid window size %ix%i",
                        width, height);

        return NULL;
    }

    fbconfig  = _glfw.hints.framebuffer;
    ctxconfig = _glfw.hints.context;
    wndconfig = _glfw.hints.window;

    wndconfig.width   = width;
    wndconfig.height  = height;
    wndconfig.title   = title;
    ctxconfig.share   = (_GLFWwindow*) share;

    if (ctxconfig.share)
    {
        if (ctxconfig.client == GLFW_NO_API ||
            ctxconfig.share->context.client == GLFW_NO_API)
        {
            _glfwInputError(GLFW_NO_WINDOW_CONTEXT, NULL);
            return NULL;
        }
    }

    if (!_glfwIsValidContextConfig(&ctxconfig))
        return NULL;

    window = calloc(1, sizeof(_GLFWwindow));
    window->next = _glfw.windowListHead;
    _glfw.windowListHead = window;

    window->videoMode.width       = width;
    window->videoMode.height      = height;
    window->videoMode.redBits     = fbconfig.redBits;
    window->videoMode.greenBits   = fbconfig.greenBits;
    window->videoMode.blueBits    = fbconfig.blueBits;
    window->videoMode.refreshRate = _glfw.hints.refreshRate;

    window->monitor     = (_GLFWmonitor*) monitor;
    window->resizable   = wndconfig.resizable;
    window->decorated   = wndconfig.decorated;
    window->autoIconify = wndconfig.autoIconify;
    window->floating    = wndconfig.floating;
    window->cursorMode  = GLFW_CURSOR_NORMAL;

    window->minwidth    = GLFW_DONT_CARE;
    window->minheight   = GLFW_DONT_CARE;
    window->maxwidth    = GLFW_DONT_CARE;
    window->maxheight   = GLFW_DONT_CARE;
    window->numer       = GLFW_DONT_CARE;
    window->denom       = GLFW_DONT_CARE;

    // Save the currently current context so it can be restored later
    previous = _glfwPlatformGetCurrentContext();
    if (ctxconfig.client != GLFW_NO_API)
        glfwMakeContextCurrent(NULL);

    // Open the actual window and create its context
    if (!_glfwPlatformCreateWindow(window, &wndconfig, &ctxconfig, &fbconfig))
    {
        glfwMakeContextCurrent((GLFWwindow*) previous);
        glfwDestroyWindow((GLFWwindow*) window);
        return NULL;
    }

    if (ctxconfig.client != GLFW_NO_API)
    {
        window->context.makeCurrent(window);

        // Retrieve the actual (as opposed to requested) context attributes
        if (!_glfwRefreshContextAttribs(&ctxconfig))
        {
            glfwMakeContextCurrent((GLFWwindow*) previous);
            glfwDestroyWindow((GLFWwindow*) window);
            return NULL;
        }

        // Restore the previously current context (or NULL)
        glfwMakeContextCurrent((GLFWwindow*) previous);
    }

    if (!window->monitor)
    {
        if (wndconfig.visible)
        {
            _glfwPlatformShowWindow(window);
            if (wndconfig.focused)
                _glfwPlatformFocusWindow(window);
        }
    }

    return (GLFWwindow*) window;
}